

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::(anonymous_namespace)::PromiseIoStream::tryPumpFrom(PromiseIoStream *this)

{
  uint64_t in_RCX;
  AsyncInputStream *in_RDX;
  long in_RSI;
  
  anon_unknown_31::PromiseIoStream::tryPumpFrom
            ((Maybe<kj::Promise<unsigned_long>_> *)this,(PromiseIoStream *)(in_RSI + -8),in_RDX,
             in_RCX);
  return;
}

Assistant:

kj::Maybe<kj::Promise<uint64_t>> tryPumpFrom(
      kj::AsyncInputStream& input, uint64_t amount = kj::maxValue) override {
    KJ_IF_MAYBE(s, stream) {
      // Call input.pumpTo() on the resolved stream instead, so that if it does some dynamic_casts
      // or whatnot to detect stream types it can retry those on the inner stream.
      return input.pumpTo(**s, amount);
    } else {
      return promise.addBranch().then([this,&input,amount]() {
        // Here we actually have no choice but to call input.pumpTo() because if we called
        // tryPumpFrom(input, amount) and it returned nullptr, what would we do? It's too late for
        // us to return nullptr. But the thing about dynamic_cast also applies.
        return input.pumpTo(*KJ_ASSERT_NONNULL(stream), amount);
      });
    }
  }